

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::uniform1iv(ReferenceContext *this,deInt32 location,deInt32 count,deInt32 *v)

{
  DataType DVar1;
  deInt32 dVar2;
  deBool dVar3;
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *this_00;
  size_type sVar4;
  reference pvVar5;
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *uniforms;
  deInt32 *v_local;
  deInt32 count_local;
  deInt32 location_local;
  ReferenceContext *this_local;
  
  do {
    if (this->m_currentProgram == (ShaderProgramObjectContainer *)0x0) {
      setError(this,0x502);
      return;
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  this_00 = &this->m_currentProgram->m_program->m_uniforms;
  if (location != -1) {
    do {
      if ((location < 0) ||
         (sVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::size(this_00),
         sVar4 <= (ulong)(long)location)) {
        setError(this,0x502);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      if (count != 1) {
        setError(this,0x502);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pvVar5 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                       (this_00,(long)location);
    DVar1 = pvVar5->type;
    if (DVar1 == TYPE_INT) {
      dVar2 = *v;
      pvVar5 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (this_00,(long)location);
      (pvVar5->value).i = dVar2;
    }
    else if ((((DVar1 - TYPE_SAMPLER_2D < 2) || (DVar1 - TYPE_SAMPLER_2D_ARRAY < 3)) ||
             (DVar1 - TYPE_INT_SAMPLER_2D < 2)) ||
            (((DVar1 - TYPE_INT_SAMPLER_2D_ARRAY < 3 || (DVar1 - TYPE_UINT_SAMPLER_2D < 2)) ||
             (DVar1 - TYPE_UINT_SAMPLER_2D_ARRAY < 3)))) {
      dVar2 = *v;
      pvVar5 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (this_00,(long)location);
      (pvVar5->value).i = dVar2;
    }
    else {
      setError(this,0x502);
    }
  }
  return;
}

Assistant:

void ReferenceContext::uniform1iv (deInt32 location, deInt32 count, const deInt32* v)
{
	RC_IF_ERROR(m_currentProgram == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	std::vector<sglr::UniformSlot>& uniforms = m_currentProgram->m_program->m_uniforms;

	if (location == -1)
		return;

	RC_IF_ERROR(location < 0 || (size_t)location >= uniforms.size(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(count != 1, GL_INVALID_OPERATION, RC_RET_VOID); // \todo [2013-12-13 pyry] Array uniforms.

	switch (uniforms[location].type)
	{
		case glu::TYPE_INT:		uniforms[location].value.i = *v;	return;

		// \note texture unit is stored to value
		case glu::TYPE_SAMPLER_2D:
		case glu::TYPE_UINT_SAMPLER_2D:
		case glu::TYPE_INT_SAMPLER_2D:
		case glu::TYPE_SAMPLER_CUBE:
		case glu::TYPE_UINT_SAMPLER_CUBE:
		case glu::TYPE_INT_SAMPLER_CUBE:
		case glu::TYPE_SAMPLER_2D_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_ARRAY:
		case glu::TYPE_SAMPLER_3D:
		case glu::TYPE_UINT_SAMPLER_3D:
		case glu::TYPE_INT_SAMPLER_3D:
		case glu::TYPE_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_INT_SAMPLER_CUBE_ARRAY:
			uniforms[location].value.i = *v;
			return;

		default:
			setError(GL_INVALID_OPERATION);
			return;
	}
}